

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

BoolParameter * __thiscall
CoreML::Specification::NetworkUpdateParameters::mutable_shuffle(NetworkUpdateParameters *this)

{
  BoolParameter *this_00;
  NetworkUpdateParameters *this_local;
  
  if (this->shuffle_ == (BoolParameter *)0x0) {
    this_00 = (BoolParameter *)operator_new(0x18);
    BoolParameter::BoolParameter(this_00);
    this->shuffle_ = this_00;
  }
  return this->shuffle_;
}

Assistant:

inline ::CoreML::Specification::BoolParameter* NetworkUpdateParameters::mutable_shuffle() {
  
  if (shuffle_ == NULL) {
    shuffle_ = new ::CoreML::Specification::BoolParameter;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NetworkUpdateParameters.shuffle)
  return shuffle_;
}